

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

void __thiscall
ON__CChangeTextureCoordinateHelper::ON__CChangeTextureCoordinateHelper
          (ON__CChangeTextureCoordinateHelper *this,ON_Mesh *mesh,int newvcnt,float **mesh_T)

{
  int iVar1;
  uint uVar2;
  ON_2fPoint *pOVar3;
  ON_TextureCoordinates *pOVar4;
  float *pfVar5;
  bool bVar6;
  bool *pbVar7;
  long lVar8;
  size_t newcap;
  ON_3dPointArray *this_00;
  ON_TextureCoordinates *local_38;
  
  this->m_mesh = mesh;
  this->m_mesh_dV = (ON_3dPointArray *)0x0;
  (this->m_TC)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_008259d8;
  (this->m_TC).m_a = (ON_TextureCoordinates **)0x0;
  (this->m_TC).m_count = 0;
  (this->m_TC).m_capacity = 0;
  this->m_vuse_count = 0;
  (this->m_vuse)._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081fa28;
  (this->m_vuse).m_a = (uint *)0x0;
  (this->m_vuse).m_count = 0;
  (this->m_vuse).m_capacity = 0;
  ON_Mesh::DestroyTopology(mesh);
  ON_Mesh::DestroyPartition(this->m_mesh);
  ON_Mesh::DestroyTree(this->m_mesh,true);
  this->m_tci = -1;
  iVar1 = (this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  newcap = (size_t)(newvcnt + iVar1);
  ON_SimpleArray<ON_3fPoint>::Reserve(&(this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>,newcap);
  bVar6 = ON_Mesh::HasDoublePrecisionVertices(this->m_mesh);
  if (bVar6) {
    this_00 = &this->m_mesh->m_dV;
    this->m_mesh_dV = this_00;
    ON_SimpleArray<ON_3dPoint>::Reserve(&this_00->super_ON_SimpleArray<ON_3dPoint>,newcap);
  }
  else {
    ON_Mesh::DestroyDoublePrecisionVertices(this->m_mesh);
  }
  bVar6 = ON_Mesh::HasVertexNormals(this->m_mesh);
  this->m_bHasVertexNormals = bVar6;
  if (bVar6) {
    ON_SimpleArray<ON_3fVector>::Reserve
              (&(this->m_mesh->m_N).super_ON_SimpleArray<ON_3fVector>,newcap);
  }
  bVar6 = ON_Mesh::HasTextureCoordinates(this->m_mesh);
  this->m_bHasVertexTextures = bVar6;
  if (bVar6) {
    pOVar3 = (this->m_mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a;
    ON_SimpleArray<ON_2fPoint>::Reserve
              (&(this->m_mesh->m_T).super_ON_SimpleArray<ON_2fPoint>,newcap);
    if (pOVar3 == (ON_2fPoint *)*mesh_T) {
      *mesh_T = &((this->m_mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a)->x;
    }
  }
  bVar6 = ON_Mesh::HasVertexColors(this->m_mesh);
  this->m_bHasVertexColors = bVar6;
  if (bVar6) {
    ON_SimpleArray<ON_Color>::Reserve(&this->m_mesh->m_C,newcap);
  }
  bVar6 = ON_Mesh::HasSurfaceParameters(this->m_mesh);
  this->m_bHasSurfaceParameters = bVar6;
  if (bVar6) {
    ON_SimpleArray<ON_2dPoint>::Reserve
              (&(this->m_mesh->m_S).super_ON_SimpleArray<ON_2dPoint>,newcap);
  }
  bVar6 = ON_Mesh::HasPrincipalCurvatures(this->m_mesh);
  this->m_bHasPrincipalCurvatures = bVar6;
  if (bVar6) {
    ON_SimpleArray<ON_SurfaceCurvature>::Reserve(&this->m_mesh->m_K,newcap);
  }
  pbVar7 = ON_Mesh::HiddenVertexArray(this->m_mesh);
  this->m_bHasHiddenVertices = pbVar7 != (bool *)0x0;
  if (pbVar7 != (bool *)0x0) {
    ON_SimpleArray<bool>::Reserve(&this->m_mesh->m_H,newcap);
  }
  this->m_bHasCachedTextures = false;
  uVar2 = (this->m_mesh->m_TC).m_count;
  ON_SimpleArray<ON_TextureCoordinates_*>::Reserve(&this->m_TC,(long)(int)uVar2);
  lVar8 = 0;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  for (; (ulong)uVar2 * 0xb8 - lVar8 != 0; lVar8 = lVar8 + 0xb8) {
    pOVar4 = (this->m_mesh->m_TC).m_a;
    if (iVar1 == *(int *)((long)&(pOVar4->m_T).m_count + lVar8)) {
      this->m_bHasCachedTextures = true;
      pfVar5 = *(float **)((long)&(pOVar4->m_T).m_a + lVar8);
      ON_SimpleArray<ON_3fPoint>::Reserve
                ((ON_SimpleArray<ON_3fPoint> *)((long)&(pOVar4->m_T)._vptr_ON_SimpleArray + lVar8),
                 newcap);
      if (pfVar5 == *mesh_T) {
        *mesh_T = *(float **)((long)&(pOVar4->m_T).m_a + lVar8);
      }
      local_38 = (ON_TextureCoordinates *)((pOVar4->m_tag).m_mapping_id.Data4 + lVar8 + -8);
      ON_SimpleArray<ON_TextureCoordinates_*>::Append(&this->m_TC,&local_38);
    }
  }
  return;
}

Assistant:

ON__CChangeTextureCoordinateHelper::ON__CChangeTextureCoordinateHelper(
    ON_Mesh& mesh,
    int newvcnt,
    float*& mesh_T )
: m_mesh(mesh)
, m_mesh_dV(0)
, m_vuse_count(0)
{
  // adding vertices invalidates this cached information.
  m_mesh.DestroyTopology();
  m_mesh.DestroyPartition();
  m_mesh.DestroyTree();

  m_tci = -1;

  const int vcnt = m_mesh.m_V.Count();

  // It is critical to reserve enough room in the arrays
  // before duplication starts.  Otherwise, during duplication,
  // a dynamic array can be reallocated, which will make
  // saved array base pointers will be invalid, and you crash
  // the next time they are used.

  m_mesh.m_V.Reserve(vcnt+newvcnt);

  if ( m_mesh.HasDoublePrecisionVertices() )
  {
    m_mesh_dV = &m_mesh.m_dV;
    m_mesh_dV->Reserve(vcnt+newvcnt);
  }
  else
  {
    m_mesh.DestroyDoublePrecisionVertices();
  }

  m_bHasVertexNormals = m_mesh.HasVertexNormals();
  if ( m_bHasVertexNormals )
    m_mesh.m_N.Reserve(vcnt+newvcnt);

  m_bHasVertexTextures = m_mesh.HasTextureCoordinates();
  if ( m_bHasVertexTextures )
  {
    float* p = (float*)m_mesh.m_T.Array();
    m_mesh.m_T.Reserve(vcnt+newvcnt);
    if ( p == mesh_T )
      mesh_T = (float*)m_mesh.m_T.Array();
  }

  m_bHasVertexColors = m_mesh.HasVertexColors();
  if ( m_bHasVertexColors )
    m_mesh.m_C.Reserve(vcnt+newvcnt);

  m_bHasSurfaceParameters = m_mesh.HasSurfaceParameters();
  if ( m_bHasSurfaceParameters )
    m_mesh.m_S.Reserve(vcnt+newvcnt);

  m_bHasPrincipalCurvatures = m_mesh.HasPrincipalCurvatures();
  if ( m_bHasPrincipalCurvatures )
    m_mesh.m_K.Reserve(vcnt+newvcnt);

  m_bHasHiddenVertices = (0 != m_mesh.HiddenVertexArray());
  if ( m_bHasHiddenVertices )
    m_mesh.m_H.Reserve(vcnt+newvcnt);

  // Set m_TC[] to be the subset of m_mesh.m_TC[] that is
  // valid for duplication.
  m_bHasCachedTextures = false;
  int tci, tccount = m_mesh.m_TC.Count();
  m_TC.Reserve(tccount);
  for ( tci = 0; tci < tccount; tci++ )
  {
    ON_TextureCoordinates& tc = m_mesh.m_TC[tci];
    if ( vcnt == tc.m_T.Count() )
    {
      m_bHasCachedTextures = true;
      float* p = (float*)tc.m_T.Array();
      tc.m_T.Reserve(vcnt+newvcnt);
      if ( p == mesh_T )
        mesh_T = (float*)tc.m_T.Array();
      m_TC.Append( &tc );
    }
  }
}